

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O3

void __thiscall JsonParser_deserialize_map_Test::TestBody(JsonParser_deserialize_map_Test *this)

{
  object *poVar1;
  longdouble *plVar2;
  char *pcVar3;
  double dVar4;
  object obj;
  json_parser parser;
  uint local_a0 [2];
  long *local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_90;
  long *local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_80;
  long local_78 [2];
  double local_68;
  double local_60;
  _Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
  local_58;
  code *local_18;
  
  local_18 = __cxa_guard_release;
  (*__M_insert<unsigned_long>)
            (&local_58,&local_18,0x94,
             "{\n\t\t\"some_true\":true,\n\t\t\"some_false\"\t:  false,\n\t\t\"some_int\": 1234,\n\t\t\"some_double\" : 12.34,\n\t\t\"some_other_double\" :0.1234,\n\t\t\"some_text\" : \"text\"\n\t}"
             ,0);
  local_98 = (long *)jessilib::object::size();
  local_a0[0] = 6;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
            ((internal *)&local_88,"obj.size()","6U",(unsigned_long *)&local_98,local_a0);
  if (local_88._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_98);
    if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_80->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/parsers/json.cpp"
               ,0xe5,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_a0,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_a0);
    if (local_98 != (long *)0x0) {
      (**(code **)(*local_98 + 8))();
    }
  }
  if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_80,local_80);
  }
  local_88 = local_78;
  std::__cxx11::u8string::_M_construct<char8_t_const*>((u8string *)&local_88,"some_true","");
  poVar1 = (object *)jessilib::object::operator[]((u8string *)&local_58);
  local_a0[0] = CONCAT31(local_a0[0]._1_3_,1);
  testing::internal::CmpHelperEQ<jessilib::object,bool>
            ((internal *)&local_98,"obj[u8\"some_true\"]","true",poVar1,(bool *)local_a0);
  if (local_88 != local_78) {
    operator_delete(local_88,local_78[0] + 1);
  }
  if (local_98._0_1_ == (Message)0x0) {
    testing::Message::Message((Message *)&local_88);
    if (local_90 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_90->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/parsers/json.cpp"
               ,0xe6,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_a0,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_a0);
    if (local_88 != (long *)0x0) {
      (**(code **)(*local_88 + 8))();
    }
  }
  if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_90,local_90);
  }
  local_88 = local_78;
  std::__cxx11::u8string::_M_construct<char8_t_const*>((u8string *)&local_88,"some_false","");
  poVar1 = (object *)jessilib::object::operator[]((u8string *)&local_58);
  local_a0[0] = local_a0[0] & 0xffffff00;
  testing::internal::CmpHelperEQ<jessilib::object,bool>
            ((internal *)&local_98,"obj[u8\"some_false\"]","false",poVar1,(bool *)local_a0);
  if (local_88 != local_78) {
    operator_delete(local_88,local_78[0] + 1);
  }
  if (local_98._0_1_ == (Message)0x0) {
    testing::Message::Message((Message *)&local_88);
    if (local_90 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_90->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/parsers/json.cpp"
               ,0xe7,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_a0,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_a0);
    if (local_88 != (long *)0x0) {
      (**(code **)(*local_88 + 8))();
    }
  }
  if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_90,local_90);
  }
  local_88 = local_78;
  std::__cxx11::u8string::_M_construct<char8_t_const*>((u8string *)&local_88,"some_int","");
  poVar1 = (object *)jessilib::object::operator[]((u8string *)&local_58);
  local_a0[0] = 0x4d2;
  testing::internal::CmpHelperEQ<jessilib::object,int>
            ((internal *)&local_98,"obj[u8\"some_int\"]","1234",poVar1,(int *)local_a0);
  if (local_88 != local_78) {
    operator_delete(local_88,local_78[0] + 1);
  }
  if (local_98._0_1_ == (Message)0x0) {
    testing::Message::Message((Message *)&local_88);
    if (local_90 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_90->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/parsers/json.cpp"
               ,0xe8,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_a0,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_a0);
    if (local_88 != (long *)0x0) {
      (**(code **)(*local_88 + 8))();
    }
  }
  if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_90,local_90);
  }
  local_88 = local_78;
  std::__cxx11::u8string::_M_construct<char8_t_const*>((u8string *)&local_88,"some_double","");
  plVar2 = (longdouble *)jessilib::object::operator[]((u8string *)&local_58);
  local_60 = (double)*plVar2;
  dVar4 = local_60;
  if (*(char *)(plVar2 + 3) != '\x03') {
    dVar4 = 0.0;
  }
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&local_98,"obj[u8\"some_double\"].get<double>()","12.34",dVar4,12.34);
  if (local_88 != local_78) {
    operator_delete(local_88,local_78[0] + 1);
  }
  if (local_98._0_1_ == (Message)0x0) {
    testing::Message::Message((Message *)&local_88);
    if (local_90 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_90->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/parsers/json.cpp"
               ,0xe9,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_a0,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_a0);
    if (local_88 != (long *)0x0) {
      (**(code **)(*local_88 + 8))();
    }
  }
  if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_90,local_90);
  }
  local_88 = local_78;
  std::__cxx11::u8string::_M_construct<char8_t_const*>((u8string *)&local_88,"some_other_double","")
  ;
  plVar2 = (longdouble *)jessilib::object::operator[]((u8string *)&local_58);
  local_68 = (double)*plVar2;
  dVar4 = local_68;
  if (*(char *)(plVar2 + 3) != '\x03') {
    dVar4 = 0.0;
  }
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&local_98,"obj[u8\"some_other_double\"].get<double>()","0.1234",dVar4,
             0.1234);
  if (local_88 != local_78) {
    operator_delete(local_88,local_78[0] + 1);
  }
  if (local_98._0_1_ == (Message)0x0) {
    testing::Message::Message((Message *)&local_88);
    if (local_90 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_90->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/parsers/json.cpp"
               ,0xea,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_a0,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_a0);
    if (local_88 != (long *)0x0) {
      (**(code **)(*local_88 + 8))();
    }
  }
  if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_90,local_90);
  }
  local_88 = local_78;
  std::__cxx11::u8string::_M_construct<char8_t_const*>((u8string *)&local_88,"some_text","");
  poVar1 = (object *)jessilib::object::operator[]((u8string *)&local_58);
  testing::internal::CmpHelperEQ<jessilib::object,char8_t[5]>
            ((internal *)&local_98,"obj[u8\"some_text\"]","u8\"text\"",poVar1,
             (char8_t (*) [5])0x46c666);
  if (local_88 != local_78) {
    operator_delete(local_88,local_78[0] + 1);
  }
  if (local_98._0_1_ == (Message)0x0) {
    testing::Message::Message((Message *)&local_88);
    if (local_90 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_90->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/parsers/json.cpp"
               ,0xeb,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_a0,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_a0);
    if (local_88 != (long *)0x0) {
      (**(code **)(*local_88 + 8))();
    }
  }
  if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_90,local_90);
  }
  std::__detail::__variant::
  _Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
  ::~_Variant_storage(&local_58);
  return;
}

Assistant:

TEST(JsonParser, serialize_boolean) {
	json_parser parser;

	EXPECT_EQ(parser.serialize<char8_t>(true), u8"true");
	EXPECT_EQ(parser.serialize<char8_t>(false), u8"false");
}